

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Set_Char_Size(FT_Face face,FT_F26Dot6 char_width,FT_F26Dot6 char_height,
                         FT_UInt horz_resolution,FT_UInt vert_resolution)

{
  FT_Error FVar1;
  undefined1 local_48 [8];
  FT_Size_RequestRec req;
  FT_UInt vert_resolution_local;
  FT_UInt horz_resolution_local;
  FT_F26Dot6 char_height_local;
  FT_F26Dot6 char_width_local;
  FT_Face face_local;
  
  _vert_resolution_local = char_height;
  char_height_local = char_height;
  if ((char_width != 0) && (char_height_local = char_width, char_height == 0)) {
    _vert_resolution_local = char_width;
  }
  req.horiResolution = vert_resolution;
  req.vertResolution = vert_resolution;
  if ((horz_resolution != 0) && (req.vertResolution = horz_resolution, vert_resolution == 0)) {
    req.horiResolution = horz_resolution;
  }
  if (char_height_local < 0x40) {
    char_height_local = 0x40;
  }
  if (_vert_resolution_local < 0x40) {
    _vert_resolution_local = 0x40;
  }
  if (req.vertResolution == 0) {
    req.horiResolution = 0x48;
    req.vertResolution = 0x48;
  }
  local_48._0_4_ = FT_SIZE_REQUEST_TYPE_NOMINAL;
  req._0_8_ = char_height_local;
  req.width = _vert_resolution_local;
  req.height._0_4_ = req.vertResolution;
  req.height._4_4_ = req.horiResolution;
  FVar1 = FT_Request_Size(face,(FT_Size_Request)local_48);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Char_Size( FT_Face     face,
                    FT_F26Dot6  char_width,
                    FT_F26Dot6  char_height,
                    FT_UInt     horz_resolution,
                    FT_UInt     vert_resolution )
  {
    FT_Size_RequestRec  req;


    /* check of `face' delayed to `FT_Request_Size' */

    if ( !char_width )
      char_width = char_height;
    else if ( !char_height )
      char_height = char_width;

    if ( !horz_resolution )
      horz_resolution = vert_resolution;
    else if ( !vert_resolution )
      vert_resolution = horz_resolution;

    if ( char_width  < 1 * 64 )
      char_width  = 1 * 64;
    if ( char_height < 1 * 64 )
      char_height = 1 * 64;

    if ( !horz_resolution )
      horz_resolution = vert_resolution = 72;

    req.type           = FT_SIZE_REQUEST_TYPE_NOMINAL;
    req.width          = char_width;
    req.height         = char_height;
    req.horiResolution = horz_resolution;
    req.vertResolution = vert_resolution;

    return FT_Request_Size( face, &req );
  }